

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O0

bool __thiscall
SqModules::reloadModule
          (SqModules *this,char *fn,bool must_exist,char *__name__,Object *exports,
          string *out_err_msg)

{
  bool bVar1;
  byte in_DL;
  vector<SqModules::Module,_std::allocator<SqModules::Module>_> *in_RDI;
  bool res;
  string errMsg;
  string *in_stack_000003e0;
  Object *in_stack_000003e8;
  char *in_stack_000003f0;
  undefined1 in_stack_000003ff;
  char *in_stack_00000400;
  SqModules *in_stack_00000408;
  string local_50 [63];
  byte local_11;
  
  local_11 = in_DL & 1;
  std::vector<SqModules::Module,_std::allocator<SqModules::Module>_>::swap
            (in_RDI,(vector<SqModules::Module,_std::allocator<SqModules::Module>_> *)
                    &in_RDI[1].
                     super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  std::vector<SqModules::Module,_std::allocator<SqModules::Module>_>::clear
            ((vector<SqModules::Module,_std::allocator<SqModules::Module>_> *)0x1dab27);
  std::__cxx11::string::string(local_50);
  bVar1 = requireModule(in_stack_00000408,in_stack_00000400,(bool)in_stack_000003ff,
                        in_stack_000003f0,in_stack_000003e8,in_stack_000003e0);
  std::vector<SqModules::Module,_std::allocator<SqModules::Module>_>::clear
            ((vector<SqModules::Module,_std::allocator<SqModules::Module>_> *)0x1dab75);
  std::__cxx11::string::~string(local_50);
  return bVar1;
}

Assistant:

bool SqModules::reloadModule(const char *fn, bool must_exist, const char *__name__, Sqrat::Object &exports, string &out_err_msg)
{
  SQRAT_ASSERT(prevModules.empty());

  modules.swap(prevModules);
  modules.clear(); // just in case

  string errMsg;
  bool res = requireModule(fn, must_exist, __name__, exports, out_err_msg);

  prevModules.clear();

  return res;
}